

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O2

cmList * __thiscall cmList::sort(cmList *this,SortConfiguration *cfg)

{
  CompareMethod CVar1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  long lVar2;
  ulong uVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last_00;
  StringSorter *this_00;
  StringSorter sorter;
  undefined1 local_448 [32];
  _Any_data local_428;
  _Manager_type local_418;
  _Invoker_type p_Stack_410;
  _Any_data local_408;
  _Manager_type local_3f8;
  _Invoker_type local_3f0;
  bool local_3e8;
  StringSorter local_3d8;
  StringSorter local_370;
  StringSorter local_308;
  StringSorter local_2a0;
  StringSorter local_238;
  StringSorter local_1d0;
  StringSorter local_168;
  StringSorter local_100;
  StringSorter local_98;
  
  CVar1 = cfg->Compare;
  if (cfg->Order < DESCENDING && (cfg->Case < INSENSITIVE && CVar1 < FILE_BASENAME)) {
    std::
    __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ((this->Values).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (this->Values).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  else {
    local_448._16_8_ = (_Manager_type)0x0;
    local_448._24_8_ = (_Invoker_type)0x0;
    local_448._0_8_ = (code *)0x0;
    local_448._8_8_ = 0;
    if (CVar1 == FILE_BASENAME) {
      local_448._0_8_ = cmsys::SystemTools::GetFilenameName;
      local_448._24_8_ =
           std::
           _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::_M_invoke;
      local_448._16_8_ =
           std::
           _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::_M_manager;
    }
    local_418 = (_Manager_type)0x0;
    p_Stack_410 = (_Invoker_type)0x0;
    local_428._M_unused._M_object = (code *)0x0;
    local_428._8_8_ = 0;
    if (cfg->Case == INSENSITIVE) {
      local_428._M_unused._M_object = cmsys::SystemTools::LowerCase;
      p_Stack_410 = std::
                    _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    ::_M_invoke;
      local_418 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  ::_M_manager;
    }
    local_408._M_unused._M_object = (void *)0x0;
    local_408._8_8_ = 0;
    local_3f0 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmList.cxx:133:7)>
                ::_M_invoke;
    if (CVar1 == NATURAL) {
      local_3f0 = std::
                  _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmList.cxx:128:9)>
                  ::_M_invoke;
    }
    local_3f8 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmList.cxx:133:7)>
                ::_M_manager;
    if (CVar1 == NATURAL) {
      local_3f8 = std::
                  _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmList.cxx:128:9)>
                  ::_M_manager;
    }
    local_3e8 = cfg->Order == DESCENDING;
    __first._M_current =
         (this->Values).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (this->Values).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    anon_unknown.dwarf_7a45aa::StringSorter::StringSorter(&local_2a0,(StringSorter *)local_448);
    anon_unknown.dwarf_7a45aa::StringSorter::StringSorter(&local_238,&local_2a0);
    anon_unknown.dwarf_7a45aa::StringSorter::StringSorter(&local_308,&local_238);
    anon_unknown.dwarf_7a45aa::StringSorter::StringSorter(&local_3d8,&local_308);
    anon_unknown.dwarf_7a45aa::StringSorter::~StringSorter(&local_308);
    if (__first._M_current != __last._M_current) {
      anon_unknown.dwarf_7a45aa::StringSorter::StringSorter(&local_1d0,&local_3d8);
      uVar3 = (long)__last._M_current - (long)__first._M_current >> 5;
      lVar2 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::StringSorter>>
                (__first,__last,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(anonymous_namespace)::StringSorter> *)&local_1d0);
      anon_unknown.dwarf_7a45aa::StringSorter::~StringSorter(&local_1d0);
      anon_unknown.dwarf_7a45aa::StringSorter::StringSorter(&local_370,&local_3d8);
      if ((long)__last._M_current - (long)__first._M_current < 0x201) {
        this_00 = &local_308;
        anon_unknown.dwarf_7a45aa::StringSorter::StringSorter(this_00,&local_370);
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::StringSorter>>
                  (__first,__last,(_Iter_comp_iter<(anonymous_namespace)::StringSorter> *)this_00);
      }
      else {
        anon_unknown.dwarf_7a45aa::StringSorter::StringSorter(&local_100,&local_370);
        __last_00._M_current = __first._M_current + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::StringSorter>>
                  (__first,__last_00,
                   (_Iter_comp_iter<(anonymous_namespace)::StringSorter> *)&local_100);
        anon_unknown.dwarf_7a45aa::StringSorter::~StringSorter(&local_100);
        anon_unknown.dwarf_7a45aa::StringSorter::StringSorter(&local_168,&local_370);
        for (; __last_00._M_current != __last._M_current;
            __last_00._M_current = __last_00._M_current + 1) {
          anon_unknown.dwarf_7a45aa::StringSorter::StringSorter(&local_98,&local_168);
          anon_unknown.dwarf_7a45aa::StringSorter::StringSorter(&local_308,&local_98);
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::StringSorter>>
                    (__last_00,(_Val_comp_iter<(anonymous_namespace)::StringSorter> *)&local_308);
          anon_unknown.dwarf_7a45aa::StringSorter::~StringSorter(&local_308);
          anon_unknown.dwarf_7a45aa::StringSorter::~StringSorter(&local_98);
        }
        this_00 = &local_168;
      }
      anon_unknown.dwarf_7a45aa::StringSorter::~StringSorter(this_00);
      anon_unknown.dwarf_7a45aa::StringSorter::~StringSorter(&local_370);
    }
    anon_unknown.dwarf_7a45aa::StringSorter::~StringSorter(&local_3d8);
    anon_unknown.dwarf_7a45aa::StringSorter::~StringSorter(&local_238);
    anon_unknown.dwarf_7a45aa::StringSorter::~StringSorter(&local_2a0);
    anon_unknown.dwarf_7a45aa::StringSorter::~StringSorter((StringSorter *)local_448);
  }
  return this;
}

Assistant:

cmList& cmList::sort(const SortConfiguration& cfg)
{
  SortConfiguration config{ cfg };

  if (config.Order == SortConfiguration::OrderMode::DEFAULT) {
    config.Order = SortConfiguration::OrderMode::ASCENDING;
  }
  if (config.Compare == SortConfiguration::CompareMethod::DEFAULT) {
    config.Compare = SortConfiguration::CompareMethod::STRING;
  }
  if (config.Case == SortConfiguration::CaseSensitivity::DEFAULT) {
    config.Case = SortConfiguration::CaseSensitivity::SENSITIVE;
  }

  if ((config.Compare == SortConfiguration::CompareMethod::STRING) &&
      (config.Case == SortConfiguration::CaseSensitivity::SENSITIVE) &&
      (config.Order == SortConfiguration::OrderMode::ASCENDING)) {
    std::sort(this->Values.begin(), this->Values.end());
  } else {
    StringSorter sorter(config);
    std::sort(this->Values.begin(), this->Values.end(), sorter);
  }

  return *this;
}